

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::EndScalarInFlow(void)

{
  int iVar1;
  undefined8 in_stack_fffffffffffffea8;
  char ch;
  allocator *paVar2;
  RegEx *in_stack_fffffffffffffeb0;
  allocator local_139;
  string local_138 [8];
  RegEx *in_stack_fffffffffffffed0;
  RegEx *in_stack_fffffffffffffed8;
  REGEX_OP in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  RegEx *in_stack_fffffffffffffef0;
  allocator local_f1;
  string local_f0 [240];
  
  ch = (char)((ulong)in_stack_fffffffffffffea8 >> 0x38);
  if (EndScalarInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EndScalarInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(in_stack_fffffffffffffeb0,ch);
      BlankOrBreak();
      RegEx::RegEx((RegEx *)0xf022c9);
      operator|(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      paVar2 = &local_f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,",]}",paVar2);
      RegEx::RegEx(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
      operator|(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      YAML::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      paVar2 = &local_139;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,",?[]{}",paVar2);
      RegEx::RegEx(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
      operator|(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      RegEx::~RegEx((RegEx *)0xf023c5);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      RegEx::~RegEx((RegEx *)0xf023e6);
      RegEx::~RegEx((RegEx *)0xf023f3);
      RegEx::~RegEx((RegEx *)0xf02400);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      RegEx::~RegEx((RegEx *)0xf02421);
      RegEx::~RegEx((RegEx *)0xf0242e);
      RegEx::~RegEx((RegEx *)0xf0243b);
      __cxa_atexit(RegEx::~RegEx,&EndScalarInFlow::e,&__dso_handle);
      __cxa_guard_release(&EndScalarInFlow()::e);
    }
  }
  return &EndScalarInFlow::e;
}

Assistant:

inline const RegEx& EndScalarInFlow() {
  static const RegEx e =
      (RegEx(':') + (BlankOrBreak() | RegEx() | RegEx(",]}", REGEX_OR))) |
      RegEx(",?[]{}", REGEX_OR);
  return e;
}